

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void lowbd_fwd_txfm2d_64x32_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  byte bVar2;
  transform_1d_avx2_conflict1 p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int8_t *piVar7;
  int16_t *piVar8;
  uint uVar9;
  undefined7 in_register_00000009;
  long lVar10;
  long lVar11;
  int iVar12;
  int32_t *piVar13;
  undefined1 *puVar14;
  __m256i *palVar15;
  __m256i *out;
  bool bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  __m256i buf0 [64];
  __m256i bufB [64];
  __m256i bufA [64];
  __m256i buf1 [256];
  longlong local_3860 [256];
  longlong local_3060 [256];
  longlong local_2860 [256];
  longlong local_2060 [2];
  undefined1 local_2050 [8224];
  
  piVar7 = av1_fwd_txfm_shift_ls[0xc];
  p_Var3 = col_txfm16x32_arr[CONCAT71(in_register_00000009,tx_type) & 0xffffffff];
  palVar15 = (__m256i *)local_2060;
  lVar11 = 0;
  do {
    lVar10 = 0;
    piVar8 = input;
    do {
      uVar4 = *(undefined8 *)(piVar8 + 4);
      uVar5 = *(undefined8 *)(piVar8 + 8);
      uVar6 = *(undefined8 *)(piVar8 + 0xc);
      *(undefined8 *)((long)local_3860 + lVar10) = *(undefined8 *)piVar8;
      *(undefined8 *)((long)local_3860 + lVar10 + 8) = uVar4;
      *(undefined8 *)((long)local_3860 + lVar10 + 0x10) = uVar5;
      *(undefined8 *)((long)local_3860 + lVar10 + 0x18) = uVar6;
      lVar10 = lVar10 + 0x20;
      piVar8 = piVar8 + stride;
    } while (lVar10 != 0x400);
    bVar2 = *piVar7;
    uVar9 = (uint)(char)bVar2;
    if ((int)uVar9 < 0) {
      auVar20._0_2_ = (undefined2)(1 << (~bVar2 & 0x1f));
      auVar20._2_2_ = auVar20._0_2_;
      auVar20._4_2_ = auVar20._0_2_;
      auVar20._6_2_ = auVar20._0_2_;
      auVar20._8_2_ = auVar20._0_2_;
      auVar20._10_2_ = auVar20._0_2_;
      auVar20._12_2_ = auVar20._0_2_;
      auVar20._14_2_ = auVar20._0_2_;
      auVar20._16_2_ = auVar20._0_2_;
      auVar20._18_2_ = auVar20._0_2_;
      auVar20._20_2_ = auVar20._0_2_;
      auVar20._22_2_ = auVar20._0_2_;
      auVar20._24_2_ = auVar20._0_2_;
      auVar20._26_2_ = auVar20._0_2_;
      auVar20._28_2_ = auVar20._0_2_;
      auVar20._30_2_ = auVar20._0_2_;
      lVar10 = 0;
      do {
        auVar17 = vpaddsw_avx2(auVar20,*(undefined1 (*) [32])((long)local_3860 + lVar10));
        auVar17 = vpsraw_avx2(auVar17,ZEXT416(-uVar9));
        *(undefined1 (*) [32])((long)local_3860 + lVar10) = auVar17;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar10 = 0;
      do {
        auVar20 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_3860 + lVar10),ZEXT416(uVar9));
        *(undefined1 (*) [32])((long)local_3860 + lVar10) = auVar20;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    (*p_Var3)((__m256i *)local_3860,(__m256i *)local_3860,'\f');
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      auVar17._0_2_ = (undefined2)(1 << (~bVar2 & 0x1f));
      auVar17._2_2_ = auVar17._0_2_;
      auVar17._4_2_ = auVar17._0_2_;
      auVar17._6_2_ = auVar17._0_2_;
      auVar17._8_2_ = auVar17._0_2_;
      auVar17._10_2_ = auVar17._0_2_;
      auVar17._12_2_ = auVar17._0_2_;
      auVar17._14_2_ = auVar17._0_2_;
      auVar17._16_2_ = auVar17._0_2_;
      auVar17._18_2_ = auVar17._0_2_;
      auVar17._20_2_ = auVar17._0_2_;
      auVar17._22_2_ = auVar17._0_2_;
      auVar17._24_2_ = auVar17._0_2_;
      auVar17._26_2_ = auVar17._0_2_;
      auVar17._28_2_ = auVar17._0_2_;
      auVar17._30_2_ = auVar17._0_2_;
      lVar10 = 0;
      do {
        auVar20 = vpaddsw_avx2(auVar17,*(undefined1 (*) [32])((long)local_3860 + lVar10));
        auVar20 = vpsraw_avx2(auVar20,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_3860 + lVar10) = auVar20;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar10 = 0;
      do {
        auVar20 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_3860 + lVar10),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_3860 + lVar10) = auVar20;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    lVar10 = 0;
    out = palVar15;
    do {
      transpose_16bit_16x16_avx2((__m256i *)((long)local_3860 + lVar10),out);
      out = out + 0x40;
      lVar10 = lVar10 + 0x200;
    } while (lVar10 == 0x200);
    lVar11 = lVar11 + 1;
    input = input + 0x10;
    palVar15 = palVar15 + 0x10;
  } while (lVar11 != 4);
  puVar14 = local_2050;
  piVar13 = output + 8;
  lVar11 = 0;
  do {
    lVar10 = 0;
    do {
      auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(puVar14 + lVar10 + -0x10));
      auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(puVar14 + lVar10));
      *(undefined1 (*) [32])((long)local_2860 + lVar10) = auVar20;
      *(undefined1 (*) [32])((long)local_3060 + lVar10) = auVar17;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x800);
    fdct64_new_avx2((__m256i *)local_2860,(__m256i *)local_2860,'\v');
    fdct64_new_avx2((__m256i *)local_3060,(__m256i *)local_3060,'\v');
    bVar2 = piVar7[2];
    if ((char)bVar2 < '\0') {
      iVar12 = 1 << (~bVar2 & 0x1f);
      auVar18._4_4_ = iVar12;
      auVar18._0_4_ = iVar12;
      auVar18._8_4_ = iVar12;
      auVar18._12_4_ = iVar12;
      auVar18._16_4_ = iVar12;
      auVar18._20_4_ = iVar12;
      auVar18._24_4_ = iVar12;
      auVar18._28_4_ = iVar12;
      lVar10 = 0;
      auVar21._8_4_ = 0x16a1;
      auVar21._0_8_ = 0x16a1000016a1;
      auVar21._12_4_ = 0x16a1;
      auVar21._16_4_ = 0x16a1;
      auVar21._20_4_ = 0x16a1;
      auVar21._24_4_ = 0x16a1;
      auVar21._28_4_ = 0x16a1;
      auVar22._8_4_ = 0x800;
      auVar22._0_8_ = 0x80000000800;
      auVar22._12_4_ = 0x800;
      auVar22._16_4_ = 0x800;
      auVar22._20_4_ = 0x800;
      auVar22._24_4_ = 0x800;
      auVar22._28_4_ = 0x800;
      do {
        auVar20 = vpaddd_avx2(auVar18,*(undefined1 (*) [32])((long)local_2860 + lVar10));
        auVar20 = vpsrad_avx2(auVar20,ZEXT416((uint)-(int)(char)bVar2));
        auVar20 = vpmulld_avx2(auVar20,auVar21);
        auVar20 = vpaddd_avx2(auVar20,auVar22);
        auVar20 = vpsrad_avx2(auVar20,0xc);
        *(undefined1 (*) [32])((long)local_2860 + lVar10) = auVar20;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    else {
      lVar10 = 0;
      auVar21._8_4_ = 0x16a1;
      auVar21._0_8_ = 0x16a1000016a1;
      auVar21._12_4_ = 0x16a1;
      auVar21._16_4_ = 0x16a1;
      auVar21._20_4_ = 0x16a1;
      auVar21._24_4_ = 0x16a1;
      auVar21._28_4_ = 0x16a1;
      auVar22._8_4_ = 0x800;
      auVar22._0_8_ = 0x80000000800;
      auVar22._12_4_ = 0x800;
      auVar22._16_4_ = 0x800;
      auVar22._20_4_ = 0x800;
      auVar22._24_4_ = 0x800;
      auVar22._28_4_ = 0x800;
      do {
        auVar20 = vpslld_avx2(*(undefined1 (*) [32])((long)local_2860 + lVar10),
                              ZEXT416((uint)(int)(char)bVar2));
        auVar20 = vpmulld_avx2(auVar20,auVar21);
        auVar20 = vpaddd_avx2(auVar20,auVar22);
        auVar20 = vpsrad_avx2(auVar20,0xc);
        *(undefined1 (*) [32])((long)local_2860 + lVar10) = auVar20;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    bVar2 = piVar7[2];
    if ((char)bVar2 < '\0') {
      iVar12 = 1 << (~bVar2 & 0x1f);
      auVar19._4_4_ = iVar12;
      auVar19._0_4_ = iVar12;
      auVar19._8_4_ = iVar12;
      auVar19._12_4_ = iVar12;
      auVar19._16_4_ = iVar12;
      auVar19._20_4_ = iVar12;
      auVar19._24_4_ = iVar12;
      auVar19._28_4_ = iVar12;
      lVar10 = 0;
      do {
        auVar20 = vpaddd_avx2(auVar19,*(undefined1 (*) [32])((long)local_3060 + lVar10));
        auVar20 = vpsrad_avx2(auVar20,ZEXT416((uint)-(int)(char)bVar2));
        auVar20 = vpmulld_avx2(auVar20,auVar21);
        auVar20 = vpaddd_avx2(auVar20,auVar22);
        auVar20 = vpsrad_avx2(auVar20,0xc);
        *(undefined1 (*) [32])((long)local_3060 + lVar10) = auVar20;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    else {
      lVar10 = 0;
      do {
        auVar20 = vpslld_avx2(*(undefined1 (*) [32])((long)local_3060 + lVar10),
                              ZEXT416((uint)(int)(char)bVar2));
        auVar20 = vpmulld_avx2(auVar20,auVar21);
        auVar20 = vpaddd_avx2(auVar20,auVar22);
        auVar20 = vpsrad_avx2(auVar20,0xc);
        *(undefined1 (*) [32])((long)local_3060 + lVar10) = auVar20;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    lVar10 = 0;
    do {
      uVar4 = *(undefined8 *)((long)local_2860 + lVar10 + 8);
      uVar5 = *(undefined8 *)((long)local_2860 + lVar10 + 0x10);
      uVar6 = *(undefined8 *)((long)local_2860 + lVar10 + 0x18);
      piVar1 = piVar13 + lVar10 + -8;
      *(undefined8 *)piVar1 = *(undefined8 *)((long)local_2860 + lVar10);
      *(undefined8 *)(piVar1 + 2) = uVar4;
      *(undefined8 *)(piVar1 + 4) = uVar5;
      *(undefined8 *)(piVar1 + 6) = uVar6;
      uVar4 = *(undefined8 *)((long)local_3060 + lVar10 + 8);
      uVar5 = *(undefined8 *)((long)local_3060 + lVar10 + 0x10);
      uVar6 = *(undefined8 *)((long)local_3060 + lVar10 + 0x18);
      piVar1 = piVar13 + lVar10;
      *(undefined8 *)piVar1 = *(undefined8 *)((long)local_3060 + lVar10);
      *(undefined8 *)(piVar1 + 2) = uVar4;
      *(undefined8 *)(piVar1 + 4) = uVar5;
      *(undefined8 *)(piVar1 + 6) = uVar6;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x400);
    puVar14 = puVar14 + 0x800;
    piVar13 = piVar13 + 0x10;
    bVar16 = lVar11 == 0;
    lVar11 = lVar11 + 1;
  } while (bVar16);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x32_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_64X32;
  __m256i buf0[64], buf1[256];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm16x32_arr[tx_type];
  const int width_div16 = (width >> 4);
  const int height_div16 = (height >> 4);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(4, height_div16); ++j) {
      transpose_16bit_16x16_avx2(buf0 + j * 16, buf1 + j * width + 16 * i);
    }
  }
  assert(tx_type == DCT_DCT);
  for (int i = 0; i < AOMMIN(2, height_div16); i++) {
    __m256i bufA[64];
    __m256i bufB[64];
    __m128i *buf = (__m128i *)(buf1 + width * i);
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm256_cvtepi16_epi32(buf[j * 2]);
      bufB[j] = _mm256_cvtepi16_epi32(buf[j * 2 + 1]);
    }
    fdct64_new_avx2(bufA, bufA, cos_bit_row);
    fdct64_new_avx2(bufB, bufB, cos_bit_row);
    round_shift_rect_array_32_avx2(bufA, bufA, 32, -shift[2], NewSqrt2);
    round_shift_rect_array_32_avx2(bufB, bufB, 32, -shift[2], NewSqrt2);

    store_output_32bit_w16(output + i * 16, bufA, bufB, 32, 32);
  }
}